

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_jit.c
# Opt level: O0

int lj_cf_jit_util_funcinfo(lua_State *L)

{
  uint uVar1;
  GCproto *pt_00;
  lua_State *plVar2;
  ulong uVar3;
  TValue *pTVar4;
  lua_State *plVar5;
  lua_State *in_RDI;
  GCtab *t_1;
  GCfunc *fn;
  GCtab *t;
  BCPos pc;
  GCproto *pt;
  undefined8 in_stack_fffffffffffffeb8;
  int b;
  lua_State *in_stack_fffffffffffffec0;
  lua_State *in_stack_fffffffffffffec8;
  lua_State *in_stack_fffffffffffffed0;
  BCPos pc_00;
  GCproto *in_stack_fffffffffffffed8;
  lua_State *in_stack_fffffffffffffee0;
  GCtab *in_stack_fffffffffffffee8;
  lua_State *in_stack_fffffffffffffef0;
  undefined8 in_stack_fffffffffffffef8;
  int idx;
  size_t in_stack_ffffffffffffff20;
  char *in_stack_ffffffffffffff28;
  lua_State *in_stack_ffffffffffffff30;
  lua_State *L_00;
  
  idx = (int)((ulong)in_stack_fffffffffffffef8 >> 0x20);
  pt_00 = check_Lproto(in_stack_fffffffffffffec8,(int)((ulong)in_stack_fffffffffffffec0 >> 0x20));
  if (pt_00 == (GCproto *)0x0) {
    uVar3 = (ulong)(in_RDI->base->u32).lo;
    lua_createtable((lua_State *)in_stack_fffffffffffffed8,
                    (int)((ulong)in_stack_fffffffffffffed0 >> 0x20),(int)in_stack_fffffffffffffed0);
    plVar5 = (lua_State *)(ulong)in_RDI->top[-1].u32.lo;
    if (*(char *)(uVar3 + 6) != '\x01') {
      setintfield(plVar5,in_stack_fffffffffffffee8,(char *)in_stack_fffffffffffffee0,
                  (int32_t)((ulong)in_stack_fffffffffffffed8 >> 0x20));
    }
    lj_str_new(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
    pTVar4 = lj_tab_setstr((lua_State *)in_stack_fffffffffffffed8,(GCtab *)in_stack_fffffffffffffed0
                           ,(GCstr *)in_stack_fffffffffffffec8);
    pTVar4->n = (double)*(long *)(uVar3 + 0x18);
    setintfield(plVar5,in_stack_fffffffffffffee8,(char *)in_stack_fffffffffffffee0,
                (int32_t)((ulong)in_stack_fffffffffffffed8 >> 0x20));
  }
  else {
    uVar1 = lj_lib_optint(in_stack_fffffffffffffed0,(int)((ulong)in_stack_fffffffffffffec8 >> 0x20),
                          (int32_t)in_stack_fffffffffffffec8);
    lua_createtable((lua_State *)in_stack_fffffffffffffed8,
                    (int)((ulong)in_stack_fffffffffffffed0 >> 0x20),(int)in_stack_fffffffffffffed0);
    pc_00 = (BCPos)((ulong)in_stack_fffffffffffffed0 >> 0x20);
    plVar2 = (lua_State *)(ulong)in_RDI->top[-1].u32.lo;
    setintfield(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,
                (char *)in_stack_fffffffffffffee0,
                (int32_t)((ulong)in_stack_fffffffffffffed8 >> 0x20));
    setintfield(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,
                (char *)in_stack_fffffffffffffee0,
                (int32_t)((ulong)in_stack_fffffffffffffed8 >> 0x20));
    setintfield(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,
                (char *)in_stack_fffffffffffffee0,
                (int32_t)((ulong)in_stack_fffffffffffffed8 >> 0x20));
    setintfield(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,
                (char *)in_stack_fffffffffffffee0,
                (int32_t)((ulong)in_stack_fffffffffffffed8 >> 0x20));
    setintfield(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,
                (char *)in_stack_fffffffffffffee0,
                (int32_t)((ulong)in_stack_fffffffffffffed8 >> 0x20));
    setintfield(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,
                (char *)in_stack_fffffffffffffee0,
                (int32_t)((ulong)in_stack_fffffffffffffed8 >> 0x20));
    setintfield(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,
                (char *)in_stack_fffffffffffffee0,
                (int32_t)((ulong)in_stack_fffffffffffffed8 >> 0x20));
    setintfield(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,
                (char *)in_stack_fffffffffffffee0,
                (int32_t)((ulong)in_stack_fffffffffffffed8 >> 0x20));
    plVar5 = plVar2;
    if (uVar1 < pt_00->sizebc) {
      in_stack_fffffffffffffee0 = in_RDI;
      lj_debug_line(pt_00,uVar1);
      setintfield(in_stack_fffffffffffffef0,(GCtab *)plVar2,(char *)in_stack_fffffffffffffee0,
                  (int32_t)((ulong)in_stack_fffffffffffffed8 >> 0x20));
    }
    b = (int)((ulong)in_stack_fffffffffffffeb8 >> 0x20);
    lua_pushboolean(in_stack_fffffffffffffec0,b);
    lua_setfield(plVar5,idx,(char *)in_stack_fffffffffffffef0);
    lua_pushboolean(in_stack_fffffffffffffec0,b);
    lua_setfield(plVar5,idx,(char *)in_stack_fffffffffffffef0);
    pTVar4 = in_RDI->top;
    in_RDI->top = pTVar4 + 1;
    uVar1 = (pt_00->chunkname).gcptr32;
    uVar3 = (ulong)uVar1;
    (pTVar4->u32).lo = uVar1;
    (pTVar4->field_2).it = 0xfffffffb;
    L_00 = in_RDI;
    lua_setfield(plVar5,idx,(char *)in_stack_fffffffffffffef0);
    lj_debug_pushloc(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,pc_00);
    lua_setfield(plVar5,idx,(char *)in_stack_fffffffffffffef0);
    plVar2 = in_RDI;
    lj_str_new(L_00,(char *)&pTVar4->u64,uVar3);
    pTVar4 = lj_tab_setstr(plVar2,(GCtab *)plVar5,(GCstr *)in_RDI);
    (pTVar4->u32).lo = (uint32_t)pt_00;
    (pTVar4->field_2).it = 0xfffffff8;
  }
  return 1;
}

Assistant:

LJLIB_CF(jit_util_funcinfo)
{
  GCproto *pt = check_Lproto(L, 1);
  if (pt) {
    BCPos pc = (BCPos)lj_lib_optint(L, 2, 0);
    GCtab *t;
    lua_createtable(L, 0, 16);  /* Increment hash size if fields are added. */
    t = tabV(L->top-1);
    setintfield(L, t, "linedefined", pt->firstline);
    setintfield(L, t, "lastlinedefined", pt->firstline + pt->numline);
    setintfield(L, t, "stackslots", pt->framesize);
    setintfield(L, t, "params", pt->numparams);
    setintfield(L, t, "bytecodes", (int32_t)pt->sizebc);
    setintfield(L, t, "gcconsts", (int32_t)pt->sizekgc);
    setintfield(L, t, "nconsts", (int32_t)pt->sizekn);
    setintfield(L, t, "upvalues", (int32_t)pt->sizeuv);
    if (pc < pt->sizebc)
      setintfield(L, t, "currentline", lj_debug_line(pt, pc));
    lua_pushboolean(L, (pt->flags & PROTO_VARARG));
    lua_setfield(L, -2, "isvararg");
    lua_pushboolean(L, (pt->flags & PROTO_CHILD));
    lua_setfield(L, -2, "children");
    setstrV(L, L->top++, proto_chunkname(pt));
    lua_setfield(L, -2, "source");
    lj_debug_pushloc(L, pt, pc);
    lua_setfield(L, -2, "loc");
    setprotoV(L, lj_tab_setstr(L, t, lj_str_newlit(L, "proto")), pt);
  } else {
    GCfunc *fn = funcV(L->base);
    GCtab *t;
    lua_createtable(L, 0, 4);  /* Increment hash size if fields are added. */
    t = tabV(L->top-1);
    if (!iscfunc(fn))
      setintfield(L, t, "ffid", fn->c.ffid);
    setintptrV(lj_tab_setstr(L, t, lj_str_newlit(L, "addr")),
	       (intptr_t)(void *)fn->c.f);
    setintfield(L, t, "upvalues", fn->c.nupvalues);
  }
  return 1;
}